

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O0

int CompareChunksProc(size_t index,size_t length,size_t number,Col_RopeChunk *chunks,
                     Col_ClientData clientData)

{
  uint *local_118;
  uint *local_110;
  uint *local_108;
  uint *local_100;
  uint *local_f8;
  Col_Char2 *local_f0;
  Col_Char2 *local_e8;
  Col_Char2 *local_e0;
  Col_Char2 *local_d8;
  Col_Char2 *local_d0;
  uint local_c8;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  uint local_b8;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  uint local_80;
  uint local_7c;
  char *data [2];
  Col_Char c2;
  Col_Char c1;
  char *p2;
  char *p1;
  size_t i;
  CompareChunksInfo *info;
  Col_ClientData clientData_local;
  Col_RopeChunk *chunks_local;
  size_t number_local;
  size_t length_local;
  size_t index_local;
  
  p2 = (char *)chunks->data;
  _c2 = (uint *)chunks[1].data;
  if (_c2 == (uint *)0x0) {
    if (*clientData != 0) {
      **clientData = index;
    }
    if (*(long *)((long)clientData + 8) != 0) {
      if (chunks->format == COL_UCS1) {
        local_7c = (uint)(byte)*(uint *)p2;
      }
      else {
        if (chunks->format == COL_UCS2) {
          local_80 = (uint)(ushort)*(uint *)p2;
        }
        else {
          if (chunks->format == COL_UCS4) {
            local_84 = *(uint *)p2;
          }
          else {
            if (chunks->format == COL_UTF8) {
              local_88 = Col_Utf8Get((Col_Char1 *)p2);
            }
            else {
              if (chunks->format == COL_UTF16) {
                local_8c = Col_Utf16Get((Col_Char2 *)p2);
              }
              else {
                local_8c = 0xffffffff;
              }
              local_88 = local_8c;
            }
            local_84 = local_88;
          }
          local_80 = local_84;
        }
        local_7c = local_80;
      }
      **(uint **)((long)clientData + 8) = local_7c;
    }
    if (*(long *)((long)clientData + 0x10) != 0) {
      **(undefined4 **)((long)clientData + 0x10) = 0xffffffff;
    }
    index_local._4_4_ = 1;
  }
  else if (chunks->data == (void *)0x0) {
    if (*clientData != 0) {
      **clientData = index;
    }
    if (*(long *)((long)clientData + 8) != 0) {
      **(undefined4 **)((long)clientData + 8) = 0xffffffff;
    }
    if (*(long *)((long)clientData + 0x10) != 0) {
      if (chunks[1].format == COL_UCS1) {
        local_90 = (uint)(byte)*_c2;
      }
      else {
        if (chunks[1].format == COL_UCS2) {
          local_94 = (uint)(ushort)*_c2;
        }
        else {
          if (chunks[1].format == COL_UCS4) {
            local_98 = *_c2;
          }
          else {
            if (chunks[1].format == COL_UTF8) {
              local_9c = Col_Utf8Get((Col_Char1 *)_c2);
            }
            else {
              if (chunks[1].format == COL_UTF16) {
                local_a0 = Col_Utf16Get((Col_Char2 *)_c2);
              }
              else {
                local_a0 = 0xffffffff;
              }
              local_9c = local_a0;
            }
            local_98 = local_9c;
          }
          local_94 = local_98;
        }
        local_90 = local_94;
      }
      **(uint **)((long)clientData + 0x10) = local_90;
    }
    index_local._4_4_ = -1;
  }
  else if ((uint *)p2 == _c2) {
    index_local._4_4_ = 0;
  }
  else {
    p1 = (char *)0x0;
    while (p1 < length) {
      if (chunks->format == COL_UCS1) {
        local_a4 = (uint)(byte)*p2;
      }
      else {
        if (chunks->format == COL_UCS2) {
          local_a8 = (uint)*(ushort *)p2;
        }
        else {
          if (chunks->format == COL_UCS4) {
            local_ac = *(uint *)p2;
          }
          else {
            if (chunks->format == COL_UTF8) {
              local_b0 = Col_Utf8Get((Col_Char1 *)p2);
            }
            else {
              if (chunks->format == COL_UTF16) {
                local_b4 = Col_Utf16Get((Col_Char2 *)p2);
              }
              else {
                local_b4 = 0xffffffff;
              }
              local_b0 = local_b4;
            }
            local_ac = local_b0;
          }
          local_a8 = local_ac;
        }
        local_a4 = local_a8;
      }
      if (chunks[1].format == COL_UCS1) {
        local_b8 = (uint)(byte)*_c2;
      }
      else {
        if (chunks[1].format == COL_UCS2) {
          local_bc = (uint)(ushort)*_c2;
        }
        else {
          if (chunks[1].format == COL_UCS4) {
            local_c0 = *_c2;
          }
          else {
            if (chunks[1].format == COL_UTF8) {
              local_c4 = Col_Utf8Get((Col_Char1 *)_c2);
            }
            else {
              if (chunks[1].format == COL_UTF16) {
                local_c8 = Col_Utf16Get((Col_Char2 *)_c2);
              }
              else {
                local_c8 = 0xffffffff;
              }
              local_c4 = local_c8;
            }
            local_c0 = local_c4;
          }
          local_bc = local_c0;
        }
        local_b8 = local_bc;
      }
      if (local_a4 != local_b8) {
        if (*clientData != 0) {
          **clientData = (long)(p1 + index);
        }
        if (*(long *)((long)clientData + 8) != 0) {
          **(uint **)((long)clientData + 8) = local_a4;
        }
        if (*(long *)((long)clientData + 0x10) != 0) {
          **(uint **)((long)clientData + 0x10) = local_b8;
        }
        if (local_a4 <= local_b8) {
          return -1;
        }
        return 1;
      }
      p1 = p1 + 1;
      if (chunks->format == COL_UCS1) {
        local_d0 = (Col_Char2 *)(p2 + 1);
      }
      else {
        if (chunks->format == COL_UCS2) {
          local_d8 = (Col_Char2 *)(p2 + 2);
        }
        else {
          if (chunks->format == COL_UCS4) {
            local_e0 = (Col_Char2 *)(p2 + 4);
          }
          else {
            if (chunks->format == COL_UTF8) {
              local_e8 = (Col_Char2 *)Col_Utf8Next((Col_Char1 *)p2);
            }
            else {
              if (chunks->format == COL_UTF16) {
                local_f0 = Col_Utf16Next((Col_Char2 *)p2);
              }
              else {
                local_f0 = (Col_Char2 *)0x0;
              }
              local_e8 = local_f0;
            }
            local_e0 = local_e8;
          }
          local_d8 = local_e0;
        }
        local_d0 = local_d8;
      }
      p2 = (char *)local_d0;
      if (chunks[1].format == COL_UCS1) {
        local_f8 = (uint *)((long)_c2 + 1);
      }
      else {
        if (chunks[1].format == COL_UCS2) {
          local_100 = (uint *)((long)_c2 + 2);
        }
        else {
          if (chunks[1].format == COL_UCS4) {
            local_108 = _c2 + 1;
          }
          else {
            if (chunks[1].format == COL_UTF8) {
              local_110 = (uint *)Col_Utf8Next((Col_Char1 *)_c2);
            }
            else {
              if (chunks[1].format == COL_UTF16) {
                local_118 = (uint *)Col_Utf16Next((Col_Char2 *)_c2);
              }
              else {
                local_118 = (uint *)0x0;
              }
              local_110 = local_118;
            }
            local_108 = local_110;
          }
          local_100 = local_108;
        }
        local_f8 = local_100;
      }
      _c2 = local_f8;
    }
    index_local._4_4_ = 0;
  }
  return index_local._4_4_;
}

Assistant:

static int
CompareChunksProc(
    size_t index,               /*!< Rope-relative index where chunks begin. */
    size_t length,              /*!< Length of chunks. */
    size_t number,              /*!< Number of chunks. Always 2. */
    const Col_RopeChunk *chunks,/*!< Array of chunks. When chunk is NULL, means
                                     the index is past the end of the traversed
                                     rope. */

    /*! [in,out] Points to #CompareChunksInfo. */
    Col_ClientData clientData)
{
    CompareChunksInfo *info = (CompareChunksInfo *) clientData;
    size_t i;
    const char *p1, *p2;
    Col_Char c1, c2;
    const char *data[2] = {(const char *) chunks[0].data,
            (const char *) chunks[1].data};

    ASSERT(number == 2);

    /*
     * Quick cases.
     */

    if (!data[1]) {
        /*
         * Chunk 1 is longer.
         */

        ASSERT(data[0]);
        if (info->posPtr) *info->posPtr = index;
        if (info->c1Ptr) *info->c1Ptr = COL_CHAR_GET(chunks[0].format, data[0]);
        if (info->c2Ptr) *info->c2Ptr = COL_CHAR_INVALID;
        return 1;
    } else if (!chunks[0].data) {
        /*
         * Chunk 2 is longer.
         */

        ASSERT(data[1]);
        if (info->posPtr) *info->posPtr = index;
        if (info->c1Ptr) *info->c1Ptr = COL_CHAR_INVALID;
        if (info->c2Ptr) *info->c2Ptr = COL_CHAR_GET(chunks[1].format, data[1]);
        return -1;
    } else if (data[0] == data[1]) {
        /*
         * Chunks are identical.
         */

        return 0;
    }

    /*
     * Compare char by char.
     */

    ASSERT(data[0]);
    ASSERT(data[1]);
    p1 = data[0];
    p2 = data[1];
    for (i = 0; i < length; i++, COL_CHAR_NEXT(chunks[0].format, p1),
            COL_CHAR_NEXT(chunks[1].format, p2)) {
        c1 = COL_CHAR_GET(chunks[0].format, p1);
        c2 = COL_CHAR_GET(chunks[1].format, p2);
        if (c1 != c2) {
            if (info->posPtr) *info->posPtr = index+i;
            if (info->c1Ptr) *info->c1Ptr = c1;
            if (info->c2Ptr) *info->c2Ptr = c2;
            return (c1 > c2 ? 1 : -1);
        }
    }

    /*
     * Chunks were equal.
     */

    return 0;
}